

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::RepeatedPrimitiveGenericTypeTraits::DestroyDefaultRepeatedFields
               (void)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<double> *pRVar5;
  RepeatedField<float> *pRVar6;
  RepeatedField<bool> *pRVar7;
  
  pRVar1 = default_repeated_field_int32_;
  if (default_repeated_field_int32_ != (RepeatedField<int> *)0x0) {
    RepeatedField<int>::~RepeatedField(default_repeated_field_int32_);
    operator_delete(pRVar1,0x10);
  }
  pRVar2 = default_repeated_field_int64_;
  if (default_repeated_field_int64_ != (RepeatedField<long> *)0x0) {
    RepeatedField<long>::~RepeatedField(default_repeated_field_int64_);
    operator_delete(pRVar2,0x10);
  }
  pRVar3 = default_repeated_field_uint32_;
  if (default_repeated_field_uint32_ != (RepeatedField<unsigned_int> *)0x0) {
    RepeatedField<unsigned_int>::~RepeatedField(default_repeated_field_uint32_);
    operator_delete(pRVar3,0x10);
  }
  pRVar4 = default_repeated_field_uint64_;
  if (default_repeated_field_uint64_ != (RepeatedField<unsigned_long> *)0x0) {
    RepeatedField<unsigned_long>::~RepeatedField(default_repeated_field_uint64_);
    operator_delete(pRVar4,0x10);
  }
  pRVar5 = default_repeated_field_double_;
  if (default_repeated_field_double_ != (RepeatedField<double> *)0x0) {
    RepeatedField<double>::~RepeatedField(default_repeated_field_double_);
    operator_delete(pRVar5,0x10);
  }
  pRVar6 = default_repeated_field_float_;
  if (default_repeated_field_float_ != (RepeatedField<float> *)0x0) {
    RepeatedField<float>::~RepeatedField(default_repeated_field_float_);
    operator_delete(pRVar6,0x10);
  }
  pRVar7 = default_repeated_field_bool_;
  if (default_repeated_field_bool_ != (RepeatedField<bool> *)0x0) {
    RepeatedField<bool>::~RepeatedField(default_repeated_field_bool_);
    operator_delete(pRVar7,0x10);
  }
  return;
}

Assistant:

void RepeatedPrimitiveGenericTypeTraits::DestroyDefaultRepeatedFields() {
  delete default_repeated_field_int32_;
  delete default_repeated_field_int64_;
  delete default_repeated_field_uint32_;
  delete default_repeated_field_uint64_;
  delete default_repeated_field_double_;
  delete default_repeated_field_float_;
  delete default_repeated_field_bool_;
}